

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIf.c
# Opt level: O3

Hop_Obj_t * Abc_NodeBuildFromMiniInt(Hop_Man_t *pMan,Vec_Int_t *vAig,int nLeaves)

{
  uint uVar1;
  int *piVar2;
  Hop_Obj_t *pHVar3;
  Hop_Obj_t *pHVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  
  iVar7 = vAig->nSize;
  uVar5 = (ulong)iVar7;
  if ((long)uVar5 < 1) {
    __assert_fail("Vec_IntSize(vAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcIf.c"
                  ,0x17c,"Hop_Obj_t *Abc_NodeBuildFromMiniInt(Hop_Man_t *, Vec_Int_t *, int)");
  }
  piVar2 = vAig->pArray;
  if (1 < piVar2[uVar5 - 1]) {
    __assert_fail("Vec_IntEntryLast(vAig) < 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcIf.c"
                  ,0x17d,"Hop_Obj_t *Abc_NodeBuildFromMiniInt(Hop_Man_t *, Vec_Int_t *, int)");
  }
  if (iVar7 == 2) {
    if (*piVar2 != 0) {
      __assert_fail("Vec_IntEntry(vAig, 0) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcIf.c"
                    ,0x185,"Hop_Obj_t *Abc_NodeBuildFromMiniInt(Hop_Man_t *, Vec_Int_t *, int)");
    }
    if (nLeaves != 1) {
      __assert_fail("nLeaves == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcIf.c"
                    ,0x186,"Hop_Obj_t *Abc_NodeBuildFromMiniInt(Hop_Man_t *, Vec_Int_t *, int)");
    }
    pHVar3 = Hop_IthVar(pMan,0);
    if (vAig->nSize < 2) {
LAB_002d5da2:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    pHVar3 = (Hop_Obj_t *)((long)vAig->pArray[1] ^ (ulong)pHVar3);
  }
  else if (iVar7 == 1) {
    if (nLeaves != 0) {
      __assert_fail("nLeaves == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcIf.c"
                    ,0x180,"Hop_Obj_t *Abc_NodeBuildFromMiniInt(Hop_Man_t *, Vec_Int_t *, int)");
    }
    pHVar3 = (Hop_Obj_t *)((long)*piVar2 ^ (ulong)pMan->pConst1 ^ 1);
  }
  else {
    if ((uVar5 & 1) == 0) {
      __assert_fail("Vec_IntSize(vAig) & 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcIf.c"
                    ,0x18d,"Hop_Obj_t *Abc_NodeBuildFromMiniInt(Hop_Man_t *, Vec_Int_t *, int)");
    }
    lVar11 = 0;
    uVar9 = 0;
    do {
      piVar2 = vAig->pArray;
      uVar1 = piVar2[lVar11 * 2];
      if (((int)uVar1 < 0) || (uVar10 = piVar2[lVar11 * 2 + 1], (int)uVar10 < 0)) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      uVar8 = uVar1 >> 1;
      uVar6 = uVar8 - nLeaves;
      if ((int)uVar8 < nLeaves) {
        pHVar3 = Hop_IthVar(pMan,uVar8);
      }
      else {
        if (((int)uVar6 < 0) || ((int)uVar5 <= (int)uVar6)) goto LAB_002d5d26;
        pHVar3 = *(Hop_Obj_t **)(piVar2 + (ulong)uVar6 * 2);
      }
      uVar8 = uVar10 >> 1;
      uVar6 = uVar8 - nLeaves;
      if ((int)uVar8 < nLeaves) {
        pHVar4 = Hop_IthVar(pMan,uVar8);
      }
      else {
        if (((int)uVar6 < 0) || (vAig->nSize <= (int)uVar6)) {
LAB_002d5d26:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pHVar4 = *(Hop_Obj_t **)(vAig->pArray + (ulong)uVar6 * 2);
      }
      pHVar3 = Hop_And(pMan,(Hop_Obj_t *)((ulong)pHVar3 ^ (ulong)(uVar1 & 1)),
                       (Hop_Obj_t *)((ulong)(uVar10 & 1) ^ (ulong)pHVar4));
      uVar1 = vAig->nSize;
      uVar5 = (ulong)uVar1;
      if ((int)uVar1 <= (int)lVar11) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
      }
      *(Hop_Obj_t **)(vAig->pArray + lVar11 * 2) = pHVar3;
      uVar10 = uVar9 + 2;
      lVar11 = lVar11 + 1;
      iVar7 = uVar9 + 3;
      uVar9 = uVar10;
    } while (iVar7 < (int)uVar1);
    if (uVar10 != uVar1 - 1) {
      __assert_fail("i == Vec_IntSize(vAig) - 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcIf.c"
                    ,0x198,"Hop_Obj_t *Abc_NodeBuildFromMiniInt(Hop_Man_t *, Vec_Int_t *, int)");
    }
    if ((int)uVar1 <= (int)uVar10) goto LAB_002d5da2;
    pHVar3 = (Hop_Obj_t *)((ulong)pHVar3 ^ (long)vAig->pArray[uVar10]);
    vAig->nSize = 0;
  }
  return pHVar3;
}

Assistant:

Hop_Obj_t * Abc_NodeBuildFromMiniInt( Hop_Man_t * pMan, Vec_Int_t * vAig, int nLeaves )
{
    assert( Vec_IntSize(vAig) > 0 );
    assert( Vec_IntEntryLast(vAig) < 2 );
    if ( Vec_IntSize(vAig) == 1 ) // const
    {
        assert( nLeaves == 0 );
        return Hop_NotCond( Hop_ManConst0(pMan), Vec_IntEntry(vAig, 0) );
    }
    if ( Vec_IntSize(vAig) == 2 ) // variable
    {
        assert( Vec_IntEntry(vAig, 0) == 0 );
        assert( nLeaves == 1 );
        return Hop_NotCond( Hop_IthVar(pMan, 0), Vec_IntEntry(vAig, 1) );
    }
    else
    {
        int i, iVar0, iVar1, iLit0, iLit1;
        Hop_Obj_t * piLit0, * piLit1, * piLit = NULL;
        assert( Vec_IntSize(vAig) & 1 );
        Vec_IntForEachEntryDouble( vAig, iLit0, iLit1, i )
        {
            iVar0 = Abc_Lit2Var( iLit0 );
            iVar1 = Abc_Lit2Var( iLit1 );
            piLit0 = Hop_NotCond( iVar0 < nLeaves ? Hop_IthVar(pMan, iVar0) : (Hop_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)vAig, iVar0 - nLeaves), Abc_LitIsCompl(iLit0) );
            piLit1 = Hop_NotCond( iVar1 < nLeaves ? Hop_IthVar(pMan, iVar1) : (Hop_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)vAig, iVar1 - nLeaves), Abc_LitIsCompl(iLit1) );
            piLit  = Hop_And( pMan, piLit0, piLit1 );
            assert( (i & 1) == 0 );
            Vec_PtrWriteEntry( (Vec_Ptr_t *)vAig, Abc_Lit2Var(i), piLit );  // overwriting entries
        }
        assert( i == Vec_IntSize(vAig) - 1 );
        piLit = Hop_NotCond( piLit, Vec_IntEntry(vAig, i) );
        Vec_IntClear( vAig ); // useless
        return piLit;
    }
}